

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_inst.cpp
# Opt level: O1

spv_result_t spvExtInstTableGet(spv_ext_inst_table *pExtInstTable,spv_target_env env)

{
  if (pExtInstTable == (spv_ext_inst_table *)0x0) {
    return SPV_ERROR_INVALID_POINTER;
  }
  if ((SPV_ENV_VULKAN_1_1 < env) && (6 < env - SPV_ENV_UNIVERSAL_1_4)) {
    return SPV_ERROR_INVALID_TABLE;
  }
  *pExtInstTable = &kTable_1_0;
  return SPV_SUCCESS;
}

Assistant:

spv_result_t spvExtInstTableGet(spv_ext_inst_table* pExtInstTable,
                                spv_target_env env) {
  if (!pExtInstTable) return SPV_ERROR_INVALID_POINTER;

  switch (env) {
    // The extended instruction sets are all version 1.0 so far.
    case SPV_ENV_UNIVERSAL_1_0:
    case SPV_ENV_VULKAN_1_0:
    case SPV_ENV_UNIVERSAL_1_1:
    case SPV_ENV_UNIVERSAL_1_2:
    case SPV_ENV_OPENCL_1_2:
    case SPV_ENV_OPENCL_EMBEDDED_1_2:
    case SPV_ENV_OPENCL_2_0:
    case SPV_ENV_OPENCL_EMBEDDED_2_0:
    case SPV_ENV_OPENCL_2_1:
    case SPV_ENV_OPENCL_EMBEDDED_2_1:
    case SPV_ENV_OPENCL_2_2:
    case SPV_ENV_OPENCL_EMBEDDED_2_2:
    case SPV_ENV_OPENGL_4_0:
    case SPV_ENV_OPENGL_4_1:
    case SPV_ENV_OPENGL_4_2:
    case SPV_ENV_OPENGL_4_3:
    case SPV_ENV_OPENGL_4_5:
    case SPV_ENV_UNIVERSAL_1_3:
    case SPV_ENV_VULKAN_1_1:
    case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
    case SPV_ENV_UNIVERSAL_1_4:
    case SPV_ENV_UNIVERSAL_1_5:
    case SPV_ENV_VULKAN_1_2:
    case SPV_ENV_UNIVERSAL_1_6:
    case SPV_ENV_VULKAN_1_3:
    case SPV_ENV_VULKAN_1_4:
      *pExtInstTable = &kTable_1_0;
      return SPV_SUCCESS;
    default:
      return SPV_ERROR_INVALID_TABLE;
  }
}